

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm.c
# Opt level: O0

void asm_tostr(ASMState *as,IRIns *ir)

{
  Reg dest;
  IRRef local_28;
  uint local_24;
  IRRef args [2];
  CCallInfo *ci;
  IRIns *ir_local;
  ASMState *as_local;
  
  asm_snap_prep(as);
  local_28 = 0x7fff;
  as->gcsteps = as->gcsteps + 1;
  if ((ir->field_0).op2 == 1) {
    local_24 = 0x7ffd;
    args[0] = 0x1d7650;
    args[1] = 0;
  }
  else {
    local_24 = (uint)(ir->field_0).op1;
    if ((ir->field_0).op2 == 0) {
      args[0] = 0x1d7640;
      args[1] = 0;
    }
    else {
      args[0] = 0x1d7660;
      args[1] = 0;
    }
  }
  asm_setupresult(as,ir,(CCallInfo *)args);
  asm_gencall(as,(CCallInfo *)args,&local_28);
  if ((ir->field_0).op2 == 1) {
    dest = ra_releasetmp(as,0x7ffd);
    asm_tvptr(as,dest,(uint)(ir->field_0).op1,1);
  }
  return;
}

Assistant:

static void asm_tostr(ASMState *as, IRIns *ir)
{
  const CCallInfo *ci;
  IRRef args[2];
  asm_snap_prep(as);
  args[0] = ASMREF_L;
  as->gcsteps++;
  if (ir->op2 == IRTOSTR_NUM) {
    args[1] = ASMREF_TMP1;  /* cTValue * */
    ci = &lj_ir_callinfo[IRCALL_lj_strfmt_num];
  } else {
    args[1] = ir->op1;  /* int32_t k */
    if (ir->op2 == IRTOSTR_INT)
      ci = &lj_ir_callinfo[IRCALL_lj_strfmt_int];
    else
      ci = &lj_ir_callinfo[IRCALL_lj_strfmt_char];
  }
  asm_setupresult(as, ir, ci);  /* GCstr * */
  asm_gencall(as, ci, args);
  if (ir->op2 == IRTOSTR_NUM)
    asm_tvptr(as, ra_releasetmp(as, ASMREF_TMP1), ir->op1, IRTMPREF_IN1);
}